

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O1

int aom_satd_avx2(tran_low_t *coeff,int length)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [32];
  undefined1 auVar5 [32];
  undefined1 auVar4 [64];
  
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  auVar3 = auVar4._0_32_;
  if (0 < length) {
    lVar2 = 0;
    do {
      auVar3 = vpabsd_avx2(*(undefined1 (*) [32])(coeff + lVar2));
      auVar3 = vpaddd_avx2(auVar3,auVar4._0_32_);
      auVar4 = ZEXT3264(auVar3);
      lVar2 = lVar2 + 8;
    } while ((int)lVar2 < length);
  }
  auVar5 = vpsrldq_avx2(auVar3,8);
  auVar3 = vpaddd_avx2(auVar5,auVar3);
  auVar5 = vpsrlq_avx2(auVar3,0x20);
  auVar3 = vpaddd_avx2(auVar3,auVar5);
  auVar1 = vpaddd_avx(auVar3._16_16_,auVar3._0_16_);
  return auVar1._0_4_;
}

Assistant:

int aom_satd_avx2(const tran_low_t *coeff, int length) {
  __m256i accum = _mm256_setzero_si256();
  int i;

  for (i = 0; i < length; i += 8, coeff += 8) {
    const __m256i src_line = _mm256_loadu_si256((const __m256i *)coeff);
    const __m256i abs = _mm256_abs_epi32(src_line);
    accum = _mm256_add_epi32(accum, abs);
  }

  {  // 32 bit horizontal add
    const __m256i a = _mm256_srli_si256(accum, 8);
    const __m256i b = _mm256_add_epi32(accum, a);
    const __m256i c = _mm256_srli_epi64(b, 32);
    const __m256i d = _mm256_add_epi32(b, c);
    const __m128i accum_128 = _mm_add_epi32(_mm256_castsi256_si128(d),
                                            _mm256_extractf128_si256(d, 1));
    return _mm_cvtsi128_si32(accum_128);
  }
}